

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<TPZGeoNodeBC_*> * __thiscall
TPZVec<TPZGeoNodeBC_*>::operator=(TPZVec<TPZGeoNodeBC_*> *this,TPZVec<TPZGeoNodeBC_*> *rval)

{
  ulong uVar1;
  TPZGeoNodeBC **ppTVar2;
  ulong uVar3;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (TPZGeoNodeBC **)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar1 = this->fNElements;
      ppTVar2 = (TPZGeoNodeBC **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      this->fStore = ppTVar2;
      if (0 < (long)uVar1) {
        uVar3 = 0;
        do {
          this->fStore[uVar3] = rval->fStore[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (TPZGeoNodeBC **)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}